

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void post_process_1pass(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  JDIMENSION local_48;
  JDIMENSION local_44;
  JDIMENSION max_rows;
  JDIMENSION num_rows;
  my_post_ptr post;
  JDIMENSION *out_row_ctr_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION *pJStack_20;
  JDIMENSION in_row_groups_avail_local;
  JDIMENSION *in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  _max_rows = cinfo->post;
  local_48 = out_rows_avail - *out_row_ctr;
  if (*(uint *)&_max_rows[2].start_pass < local_48) {
    local_48 = *(JDIMENSION *)&_max_rows[2].start_pass;
  }
  local_44 = 0;
  post = (my_post_ptr)out_row_ctr;
  out_row_ctr_local = (JDIMENSION *)output_buf;
  output_buf_local._4_4_ = in_row_groups_avail;
  pJStack_20 = in_row_group_ctr;
  in_row_group_ctr_local = (JDIMENSION *)input_buf;
  input_buf_local = (JSAMPIMAGE)cinfo;
  (*cinfo->upsample->upsample)
            (cinfo,input_buf,in_row_group_ctr,in_row_groups_avail,
             (JSAMPARRAY)_max_rows[1].post_process_data,&local_44,local_48);
  (*(code *)input_buf_local[0x51][1])
            (input_buf_local,_max_rows[1].post_process_data,
             out_row_ctr_local + (ulong)*(uint *)&(post->pub).start_pass * 2,local_44);
  *(JDIMENSION *)&(post->pub).start_pass = local_44 + *(int *)&(post->pub).start_pass;
  return;
}

Assistant:

METHODDEF(void)
post_process_1pass (j_decompress_ptr cinfo,
		    JSAMPIMAGE input_buf, JDIMENSION *in_row_group_ctr,
		    JDIMENSION in_row_groups_avail,
		    JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
		    JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr) cinfo->post;
  JDIMENSION num_rows, max_rows;

  /* Fill the buffer, but not more than what we can dump out in one go. */
  /* Note we rely on the upsampler to detect bottom of image. */
  max_rows = out_rows_avail - *out_row_ctr;
  if (max_rows > post->strip_height)
    max_rows = post->strip_height;
  num_rows = 0;
  (*cinfo->upsample->upsample) (cinfo,
		input_buf, in_row_group_ctr, in_row_groups_avail,
		post->buffer, &num_rows, max_rows);
  /* Quantize and emit data. */
  (*cinfo->cquantize->color_quantize) (cinfo,
		post->buffer, output_buf + *out_row_ctr, (int) num_rows);
  *out_row_ctr += num_rows;
}